

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexHull.cpp
# Opt level: O2

int above(btVector3 *vertices,int3 *t,btVector3 *p,btScalar epsilon)

{
  btVector3 bVar1;
  btVector3 bVar2;
  float local_38;
  float fStack_34;
  float local_28;
  
  bVar1 = TriNormal(vertices + t->x,vertices + t->y,vertices + t->z);
  bVar2 = operator-(p,vertices + t->x);
  local_38 = bVar1.m_floats[0];
  fStack_34 = bVar1.m_floats[1];
  local_28 = bVar1.m_floats[2];
  return (int)(epsilon <
              bVar2.m_floats[2] * local_28 +
              local_38 * bVar2.m_floats[0] + fStack_34 * bVar2.m_floats[1]);
}

Assistant:

int above(btVector3* vertices,const int3& t, const btVector3 &p, btScalar epsilon) 
{
	btVector3 n=TriNormal(vertices[t[0]],vertices[t[1]],vertices[t[2]]);
	return (btDot(n,p-vertices[t[0]]) > epsilon); // EPSILON???
}